

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O3

Value * __thiscall flow::IRBuilder::createSIn(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  long lVar1;
  long lVar2;
  BinaryInstr<(flow::BinaryOperator)31,_(flow::LiteralType)1> *pBVar3;
  string local_78;
  Value *local_58;
  Value *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_58 = rhs;
  local_50 = lhs;
  if (((lhs == (Value *)0x0) ||
      (lVar1 = __dynamic_cast(lhs,&Value::typeinfo,
                              &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0)
      , rhs == (Value *)0x0 || lVar1 == 0)) ||
     (lVar2 = __dynamic_cast(rhs,&Value::typeinfo,
                             &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0),
     lVar2 == 0)) {
    makeName(&local_78,this,name);
    pBVar3 = insert<flow::BinaryInstr<(flow::BinaryOperator)31,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                       (this,&local_50,&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return (Value *)pBVar3;
    }
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,*(long *)(lVar2 + 0x48),
               *(long *)(lVar2 + 0x50) + *(long *)(lVar2 + 0x48));
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x48),
               *(long *)(lVar1 + 0x50) + *(long *)(lVar1 + 0x48));
    lVar1 = std::__cxx11::string::find((char *)&local_78,(ulong)local_48[0],0);
    lVar2 = 0x18;
    if (lVar1 == -1) {
      lVar2 = 0x68;
    }
    pBVar3 = (BinaryInstr<(flow::BinaryOperator)31,_(flow::LiteralType)1> *)
             ((long)&(this->program_->modules_).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar2);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return (Value *)pBVar3;
    }
  }
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  return (Value *)pBVar3;
}

Assistant:

Value* IRBuilder::createSIn(Value* lhs, Value* rhs, const std::string& name) {
  if (auto a = dynamic_cast<ConstantString*>(lhs))
    if (auto b = dynamic_cast<ConstantString*>(rhs))
      return getBoolean(b->get().find(a->get()) != std::string::npos);

  return insert<SInInstr>(lhs, rhs, makeName(name));
}